

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ss_mintrosort(uchar *T,int *PA,int *first,int *last,int depth)

{
  byte bVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  int depth_00;
  uint *puVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uchar *Td;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  uint *puVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  ulong local_1e8;
  anon_struct_24_4_d8a55aef stack [16];
  
  iVar3 = ss_ilg((int)((ulong)((long)last - (long)first) >> 2));
  uVar22 = 0;
  depth_00 = 2;
LAB_001b0ba5:
  do {
    uVar22 = uVar22 & 0xffffffff;
    iVar5 = iVar3;
    while( true ) {
      uVar21 = (long)last - (long)first;
      uVar19 = (long)uVar21 >> 2;
      iVar6 = (int)uVar22;
      if (8 < (long)uVar19) break;
      if (1 < (long)uVar19) {
        for (puVar8 = (uint *)last + -2; first <= puVar8; puVar8 = puVar8 + -1) {
          uVar12 = *puVar8;
          puVar9 = puVar8 + 1;
          uVar14 = puVar8[1];
          while (iVar3 = ss_compare(T,PA + (int)uVar12,PA + (int)uVar14,depth_00), puVar7 = puVar9,
                0 < iVar3) {
            do {
              puVar9 = puVar7 + 1;
              puVar7[-1] = uVar14;
              if (last <= puVar9) goto LAB_001b0c47;
              uVar14 = *puVar9;
              puVar7 = puVar9;
            } while ((int)uVar14 < 0);
          }
LAB_001b0c47:
          if (iVar3 == 0) {
            *puVar9 = ~*puVar9;
          }
          puVar9[-1] = uVar12;
        }
      }
      if (iVar6 < 0) {
        __assert_fail("0 <= ssize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb65e,
                      "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)");
      }
      bVar23 = uVar22 == 0;
      uVar22 = uVar22 - 1;
      if (bVar23) {
        return;
      }
      first = stack[uVar22].a;
      last = stack[uVar22].b;
      depth_00 = stack[uVar22].c;
      iVar5 = stack[uVar22].d;
    }
    Td = T + depth_00;
    iVar3 = iVar5 + -1;
    if (iVar5 == 0) {
      iVar18 = (int)uVar19;
      if ((uVar19 & 1) == 0) {
        local_1e8 = (ulong)(iVar18 - 1U);
        uVar13 = (long)(int)(iVar18 - 1U) / 2;
        iVar4 = (int)uVar13;
        uVar13 = uVar13 & 0xffffffff;
        uVar12 = ((uint *)first)[(long)iVar18 + -1];
        if (Td[PA[(int)((uint *)first)[iVar4]]] < Td[PA[(int)uVar12]]) {
          ((uint *)first)[(long)iVar18 + -1] = ((uint *)first)[iVar4];
          ((uint *)first)[iVar4] = uVar12;
        }
      }
      else {
        uVar13 = (long)((ulong)(uint)(iVar18 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) / 2 &
                 0xffffffff;
        local_1e8 = uVar19 & 0xffffffff;
      }
      while( true ) {
        iVar18 = (int)local_1e8;
        if ((int)uVar13 < 1) break;
        uVar12 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar12;
        ss_fixdown(Td,PA,first,uVar12,iVar18);
      }
      if ((uVar19 & 1) == 0) {
        uVar12 = *first;
        *first = ((uint *)first)[iVar18];
        ((uint *)first)[iVar18] = uVar12;
        ss_fixdown(Td,PA,first,0,iVar18);
      }
      uVar19 = (ulong)(iVar18 - 1);
      for (; 1 < (int)local_1e8; local_1e8 = (ulong)((int)local_1e8 - 1)) {
        uVar12 = *first;
        *first = ((uint *)first)[uVar19];
        ss_fixdown(Td,PA,first,0,(int)uVar19);
        ((uint *)first)[uVar19] = uVar12;
        uVar19 = uVar19 - 1;
      }
    }
    if (0 < iVar5) {
      uVar12 = (uint)(uVar21 >> 2);
      puVar8 = (uint *)first +
               (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar21 >> 2 & 0xffffffff) /
                    2);
      if ((int)uVar12 < 0x201) {
        if ((int)uVar12 < 0x21) {
          puVar9 = (uint *)last + -1;
          puVar7 = (uint *)first;
          goto LAB_001b0f87;
        }
        uVar19 = (ulong)(uint)((int)(uVar21 >> 4) << 2);
        puVar7 = (uint *)last + -1;
        puVar10 = (uint *)((long)puVar7 - uVar19);
        uVar12 = *(uint *)((long)first + uVar19);
        puVar9 = (uint *)((long)first + uVar19);
        puVar20 = puVar8;
        if (Td[PA[(int)*puVar8]] < Td[PA[(int)uVar12]]) {
          puVar20 = puVar9;
          uVar12 = *puVar8;
          puVar9 = puVar8;
        }
        uVar14 = *puVar10;
        puVar8 = puVar7;
        if (Td[PA[(int)((uint *)last)[-1]]] < Td[PA[(int)uVar14]]) {
          puVar8 = puVar10;
          uVar14 = ((uint *)last)[-1];
          puVar10 = puVar7;
        }
        puVar7 = puVar8;
        if (Td[PA[(int)uVar14]] < Td[PA[(int)uVar12]]) {
          puVar7 = puVar20;
          puVar20 = puVar8;
          puVar10 = puVar9;
        }
        uVar12 = *first;
        puVar9 = puVar20;
        puVar8 = (uint *)first;
        if (Td[PA[(int)*puVar20]] < Td[PA[(int)uVar12]]) {
          puVar9 = (uint *)first;
          uVar12 = *puVar20;
          puVar8 = puVar20;
        }
        if (Td[PA[(int)uVar12]] <= Td[PA[(int)*puVar10]]) {
          puVar8 = puVar10;
          puVar7 = puVar9;
        }
        if (Td[PA[(int)*puVar7]] <= Td[PA[(int)*puVar8]]) {
          puVar8 = puVar7;
        }
      }
      else {
        uVar19 = uVar21 >> 5 & 0x1fffffff;
        puVar7 = (uint *)ss_median3(Td,PA,first,(int *)((uint *)first + uVar19),
                                    (int *)((long)first + (ulong)(uVar12 & 0xfffffff8)));
        puVar8 = (uint *)ss_median3(Td,PA,(int *)(puVar8 + -uVar19),(int *)puVar8,
                                    (int *)(puVar8 + uVar19));
        puVar9 = (uint *)last + -1;
        puVar9 = (uint *)ss_median3(Td,PA,(int *)((long)puVar9 - (ulong)(uVar12 & 0xfffffff8)),
                                    (int *)(puVar9 + -uVar19),(int *)puVar9);
LAB_001b0f87:
        puVar8 = (uint *)ss_median3(Td,PA,(int *)puVar7,(int *)puVar8,(int *)puVar9);
      }
      bVar1 = Td[PA[(int)*puVar8]];
      uVar12 = *first;
      *first = *puVar8;
      *puVar8 = uVar12;
      puVar8 = (uint *)first;
      do {
        puVar8 = puVar8 + 1;
        puVar9 = (uint *)last;
        puVar7 = puVar8;
        if (last <= puVar8) goto LAB_001b1157;
      } while (Td[PA[(int)*puVar8]] == bVar1);
      if (Td[PA[(int)*puVar8]] < bVar1) {
        while (puVar8 = puVar8 + 1, puVar8 < last) {
          uVar12 = *puVar8;
          if (bVar1 < Td[PA[(int)uVar12]]) break;
          if (Td[PA[(int)uVar12]] == bVar1) {
            *puVar8 = *puVar7;
            *puVar7 = uVar12;
            puVar7 = puVar7 + 1;
          }
        }
      }
LAB_001b1157:
      do {
        puVar9 = puVar9 + -1;
        puVar10 = puVar9;
        if (puVar9 <= puVar8) goto LAB_001b1222;
      } while (Td[PA[(int)*puVar9]] == bVar1);
      if (bVar1 < Td[PA[(int)*puVar9]]) {
        while (puVar20 = puVar9 + -1, puVar8 < puVar20) {
          uVar12 = *puVar20;
          if (Td[PA[(int)uVar12]] < bVar1) break;
          puVar9 = puVar20;
          if (Td[PA[(int)uVar12]] == bVar1) {
            *puVar20 = *puVar10;
            *puVar10 = uVar12;
            puVar10 = puVar10 + -1;
          }
        }
        puVar9 = puVar9 + -1;
      }
LAB_001b1222:
      if (puVar8 < puVar9) {
        uVar12 = *puVar8;
        *puVar8 = *puVar9;
        *puVar9 = uVar12;
        while (puVar8 = puVar8 + 1, puVar8 < puVar9) {
          uVar12 = *puVar8;
          if (bVar1 < Td[PA[(int)uVar12]]) break;
          if (Td[PA[(int)uVar12]] == bVar1) {
            *puVar8 = *puVar7;
            *puVar7 = uVar12;
            puVar7 = puVar7 + 1;
          }
        }
LAB_001b120b:
        puVar9 = puVar9 + -1;
        if (puVar8 < puVar9) {
          uVar12 = *puVar9;
          if (Td[PA[(int)uVar12]] < bVar1) goto LAB_001b1222;
          if (Td[PA[(int)uVar12]] == bVar1) {
            *puVar9 = *puVar10;
            *puVar10 = uVar12;
            puVar10 = puVar10 + -1;
          }
          goto LAB_001b120b;
        }
        goto LAB_001b1222;
      }
      if (puVar10 < puVar7) {
        if (Td[(long)PA[*first] + -1] < bVar1) {
          first = ss_partition(PA,first,last,depth_00);
          iVar5 = ss_ilg((int)((ulong)((long)last - (long)first) >> 2));
        }
        depth_00 = depth_00 + 1;
        iVar3 = iVar5;
        goto LAB_001b0ba5;
      }
      uVar19 = (ulong)((long)puVar7 - (long)first) >> 2;
      uVar21 = (long)puVar8 - (long)puVar7 >> 2;
      if ((int)uVar21 <= (int)uVar19) {
        uVar19 = uVar21;
      }
      lVar17 = 0;
      for (uVar13 = uVar19 & 0xffffffff; 0 < (int)uVar13; uVar13 = (ulong)((int)uVar13 - 1)) {
        uVar2 = *(undefined4 *)((long)first + lVar17);
        *(undefined4 *)((long)first + lVar17) =
             *(undefined4 *)((long)puVar8 + lVar17 + (long)(int)uVar19 * -4);
        *(undefined4 *)((long)puVar8 + lVar17 + (long)(int)uVar19 * -4) = uVar2;
        lVar17 = lVar17 + 4;
      }
      uVar13 = (long)puVar10 + (4 - (long)puVar8) >> 2;
      uVar12 = (int)((ulong)((long)last - (long)puVar10) >> 2) - 1;
      uVar19 = (ulong)uVar12;
      if ((int)uVar13 <= (int)uVar12) {
        uVar19 = uVar13 & 0xffffffff;
      }
      iVar5 = (int)uVar19;
      lVar17 = 0;
      for (; 0 < (int)uVar19; uVar19 = (ulong)((int)uVar19 - 1)) {
        uVar2 = *(undefined4 *)((long)puVar8 + lVar17);
        *(undefined4 *)((long)puVar8 + lVar17) =
             *(undefined4 *)((long)last + lVar17 + (long)iVar5 * -4);
        *(undefined4 *)((long)last + lVar17 + (long)iVar5 * -4) = uVar2;
        lVar17 = lVar17 + 4;
      }
      puVar8 = (uint *)first + uVar21;
      puVar7 = (uint *)last + -uVar13;
      puVar9 = puVar8;
      if (Td[(long)PA[(int)*puVar8] + -1] < bVar1) {
        puVar9 = (uint *)ss_partition(PA,(int *)puVar8,(int *)puVar7,depth_00);
      }
      lVar17 = (long)puVar7 - (long)puVar9 >> 2;
      iVar5 = (int)lVar17;
      if ((long)uVar13 < (long)uVar21) {
        if ((long)uVar21 <= lVar17) {
          if (0xf < iVar6) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b8,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          stack[iVar6].a = (int *)puVar9;
          stack[iVar6].b = (int *)puVar7;
          stack[iVar6].c = depth_00 + 1;
          iVar5 = ss_ilg(iVar5);
          stack[iVar6].d = iVar5;
          if (uVar22 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b9,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          iVar6 = iVar6 + 1;
          stack[iVar6].a = first;
          stack[iVar6].b = (int *)puVar8;
          stack[iVar6].c = depth_00;
          uVar22 = uVar22 + 2;
          stack[iVar6].d = iVar3;
          first = (int *)puVar7;
          goto LAB_001b0ba5;
        }
        if ((long)uVar13 <= lVar17) {
          if (0xf < iVar6) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6bc,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          stack[iVar6].a = first;
          stack[iVar6].b = (int *)puVar8;
          stack[iVar6].c = depth_00;
          stack[iVar6].d = iVar3;
          if (uVar22 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6bd,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          iVar6 = iVar6 + 1;
          stack[iVar6].a = (int *)puVar9;
          stack[iVar6].b = (int *)puVar7;
          stack[iVar6].c = depth_00 + 1;
          iVar5 = ss_ilg(iVar5);
          uVar22 = uVar22 + 2;
          stack[iVar6].d = iVar5;
          first = (int *)puVar7;
          goto LAB_001b0ba5;
        }
        if (0xf < iVar6) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6c0,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        stack[iVar6].a = first;
        stack[iVar6].b = (int *)puVar8;
        stack[iVar6].c = depth_00;
        stack[iVar6].d = iVar3;
        if (uVar22 == 0xf) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6c1,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        iVar6 = iVar6 + 1;
        stack[iVar6].a = (int *)puVar7;
        stack[iVar6].b = last;
        stack[iVar6].c = depth_00;
        stack[iVar6].d = iVar3;
      }
      else {
        if ((long)uVar13 <= lVar17) {
          if (0xf < iVar6) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6aa,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          stack[iVar6].a = (int *)puVar9;
          stack[iVar6].b = (int *)puVar7;
          stack[iVar6].c = depth_00 + 1;
          iVar5 = ss_ilg(iVar5);
          stack[iVar6].d = iVar5;
          if (uVar22 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6ab,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          iVar6 = iVar6 + 1;
          stack[iVar6].a = (int *)puVar7;
          stack[iVar6].b = last;
          stack[iVar6].c = depth_00;
          uVar22 = uVar22 + 2;
          stack[iVar6].d = iVar3;
          last = (int *)puVar8;
          goto LAB_001b0ba5;
        }
        if ((long)uVar21 <= lVar17) {
          if (0xf < iVar6) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6ae,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          stack[iVar6].a = (int *)puVar7;
          stack[iVar6].b = last;
          stack[iVar6].c = depth_00;
          stack[iVar6].d = iVar3;
          if (uVar22 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6af,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          iVar6 = iVar6 + 1;
          stack[iVar6].a = (int *)puVar9;
          stack[iVar6].b = (int *)puVar7;
          stack[iVar6].c = depth_00 + 1;
          iVar5 = ss_ilg(iVar5);
          uVar22 = uVar22 + 2;
          stack[iVar6].d = iVar5;
          last = (int *)puVar8;
          goto LAB_001b0ba5;
        }
        if (0xf < iVar6) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6b2,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        stack[iVar6].a = (int *)puVar7;
        stack[iVar6].b = last;
        stack[iVar6].c = depth_00;
        stack[iVar6].d = iVar3;
        if (uVar22 == 0xf) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6b3,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        iVar6 = iVar6 + 1;
        stack[iVar6].a = first;
        stack[iVar6].b = (int *)puVar8;
        stack[iVar6].c = depth_00;
        stack[iVar6].d = iVar3;
      }
      uVar22 = uVar22 + 2;
      depth_00 = depth_00 + 1;
      iVar3 = ss_ilg(iVar5);
      first = (int *)puVar9;
      last = (int *)puVar7;
      goto LAB_001b0ba5;
    }
    bVar1 = Td[PA[*first]];
    do {
      bVar11 = bVar1;
      puVar8 = (uint *)first;
      lVar17 = 0;
      do {
        lVar15 = lVar17;
        puVar9 = (uint *)((long)puVar8 + lVar15 + 4);
        if (last <= puVar9) goto LAB_001b0e40;
        lVar17 = lVar15 + 4;
      } while (bVar11 == Td[PA[(int)*puVar9]]);
      first = (int *)(lVar17 + (long)puVar8);
      bVar1 = Td[PA[(int)*puVar9]];
    } while (lVar17 < 5);
LAB_001b0e40:
    puVar7 = (uint *)((long)puVar8 + lVar15 + 4);
    puVar9 = puVar8;
    if (Td[(long)PA[(int)*puVar8] + -1] < bVar11) {
      puVar9 = (uint *)ss_partition(PA,(int *)puVar8,(int *)puVar7,depth_00);
    }
    lVar16 = (long)puVar8 + (lVar15 - (long)puVar9) + 4 >> 2;
    lVar17 = (long)last + (-lVar15 - (long)puVar8) + -4 >> 2;
    iVar5 = (int)lVar16;
    first = (int *)puVar7;
    if (lVar17 < lVar16) {
      if (lVar17 < 2) {
        depth_00 = depth_00 + 1;
        iVar3 = ss_ilg(iVar5);
        first = (int *)puVar9;
        last = (int *)puVar7;
      }
      else {
        if (0xf < iVar6) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb678,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        stack[iVar6].a = (int *)puVar9;
        stack[iVar6].b = (int *)puVar7;
        stack[iVar6].c = depth_00 + 1;
        iVar3 = ss_ilg(iVar5);
        uVar22 = uVar22 + 1;
        stack[iVar6].d = iVar3;
        iVar3 = -1;
      }
    }
    else {
      iVar3 = -1;
      if (1 < lVar16) {
        if (0xf < iVar6) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb671,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        stack[iVar6].a = (int *)puVar7;
        stack[iVar6].b = last;
        stack[iVar6].c = depth_00;
        uVar22 = uVar22 + 1;
        stack[iVar6].d = -1;
        depth_00 = depth_00 + 1;
        iVar3 = ss_ilg(iVar5);
        first = (int *)puVar9;
        last = (int *)puVar7;
      }
    }
  } while( true );
}

Assistant:

static
void
ss_mintrosort(const unsigned char *T, const int *PA,
              int *first, int *last,
              int depth) {
#define STACK_SIZE SS_MISORT_STACKSIZE
  struct { int *a, *b, c; int d; } stack[STACK_SIZE];
  const unsigned char *Td;
  int *a, *b, *c, *d, *e, *f;
  int s, t;
  int ssize;
  int limit;
  int v, x = 0;

  for(ssize = 0, limit = ss_ilg(last - first);;) {

    if((last - first) <= SS_INSERTIONSORT_THRESHOLD) {
#if 1 < SS_INSERTIONSORT_THRESHOLD
      if(1 < (last - first)) { ss_insertionsort(T, PA, first, last, depth); }
#endif
      STACK_POP(first, last, depth, limit);
      continue;
    }

    Td = T + depth;
    if(limit-- == 0) { ss_heapsort(Td, PA, first, last - first); }
    if(limit < 0) {
      for(a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if((x = Td[PA[*a]]) != v) {
          if(1 < (a - first)) { break; }
          v = x;
          first = a;
        }
      }
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, a, depth);
      }
      if((a - first) <= (last - a)) {
        if(1 < (a - first)) {
          STACK_PUSH(a, last, depth, -1);
          last = a, depth += 1, limit = ss_ilg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if(1 < (last - a)) {
          STACK_PUSH(first, a, depth + 1, ss_ilg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = ss_ilg(a - first);
        }
      }
      continue;
    }

    /* choose pivot */
    a = ss_pivot(Td, PA, first, last);
    v = Td[PA[*a]];
    SWAP(*first, *a);

    /* partition */
    for(b = first; (++b < last) && ((x = Td[PA[*b]]) == v);) { }
    if(((a = b) < last) && (x < v)) {
      for(; (++b < last) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
    }
    for(c = last; (b < --c) && ((x = Td[PA[*c]]) == v);) { }
    if((b < (d = c)) && (x > v)) {
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }
    for(; b < c;) {
      SWAP(*b, *c);
      for(; (++b < c) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }

    if(a <= d) {
      c = b - 1;

      if((s = a - first) > (t = b - a)) { s = t; }
      for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
      if((s = d - c) > (t = last - d - 1)) { s = t; }
      for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }

      a = first + (b - a), c = last - (d - c);
      b = (v <= Td[PA[*a] - 1]) ? a : ss_partition(PA, a, c, depth);

      if((a - first) <= (last - c)) {
        if((last - c) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(c, last, depth, limit);
          last = a;
        } else if((a - first) <= (c - b)) {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          last = a;
        } else {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      } else {
        if((a - first) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(first, a, depth, limit);
          first = c;
        } else if((last - c) <= (c - b)) {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          first = c;
        } else {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      }
    } else {
      limit += 1;
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, last, depth);
        limit = ss_ilg(last - first);
      }
      depth += 1;
    }
  }
#undef STACK_SIZE
}